

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraylist.cpp
# Opt level: O1

QByteArray *
QtPrivate::QByteArrayList_join
          (QByteArray *__return_storage_ptr__,QByteArrayList *that,char *sep,qsizetype seplen)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  qsizetype *pqVar4;
  long lVar5;
  long lVar6;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar6 = (that->d).size;
  if (lVar6 == 0) {
    lVar3 = 0;
  }
  else {
    pqVar4 = &(((that->d).ptr)->d).size;
    lVar3 = 0;
    lVar5 = lVar6;
    do {
      lVar3 = lVar3 + *pqVar4;
      pqVar4 = pqVar4 + 3;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  lVar5 = 0;
  if (lVar6 != 0) {
    lVar5 = (lVar6 + -1) * seplen;
  }
  lVar5 = lVar5 + lVar3;
  if (lVar5 != 0) {
    pDVar2 = (__return_storage_ptr__->d).d;
    if (((pDVar2 == (Data *)0x0) ||
        (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((long)((((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
               (pDVar2->super_QArrayData).alloc) - (long)(__return_storage_ptr__->d).ptr) < lVar5))
    {
      lVar6 = (__return_storage_ptr__->d).size;
      if (lVar5 < lVar6) {
        lVar5 = lVar6;
      }
      QByteArray::reallocData(__return_storage_ptr__,lVar5,KeepSize);
    }
    pDVar2 = (__return_storage_ptr__->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  lVar6 = (that->d).size;
  if (lVar6 != 0) {
    lVar3 = 0;
    do {
      if (lVar3 != 0) {
        QByteArray::append(__return_storage_ptr__,sep,seplen);
      }
      QByteArray::append(__return_storage_ptr__,
                         (QByteArray *)((long)&(((that->d).ptr)->d).d + lVar3));
      lVar3 = lVar3 + 0x18;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QtPrivate::QByteArrayList_join(const QByteArrayList *that, const char *sep, qsizetype seplen)
{
    QByteArray res;
    if (const qsizetype joinedSize = QByteArrayList_joinedSize(that, seplen))
        res.reserve(joinedSize); // don't call reserve(0) - it allocates one byte for the NUL
    const qsizetype size = that->size();
    for (qsizetype i = 0; i < size; ++i) {
        if (i)
            res.append(sep, seplen);
        res += that->at(i);
    }
    return res;
}